

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

pos_type __thiscall sai::ifstreambuf::seekpos(ifstreambuf *this,pos_type Position,openmode Mode)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  pointer pvVar4;
  pointer pvVar5;
  openmode Mode_local;
  ifstreambuf *this_local;
  pos_type Position_local;
  
  Position_local._M_off = (streamoff)Position._M_state;
  this_local = (ifstreambuf *)Position._M_off;
  _Var2 = std::operator&(Mode,_S_in);
  if (_Var2 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    uVar3 = std::fpos::operator_cast_to_long((fpos *)&this_local);
    this->CurrentPage = (uint32_t)((uVar3 & 0xffffffff) >> 0xc);
    if ((this->CurrentPage < this->PageCount) &&
       (bVar1 = FetchPage(this,this->CurrentPage,&this->Buffer), bVar1)) {
      pvVar4 = std::array<unsigned_char,_4096UL>::data(&(this->Buffer).u8);
      pvVar5 = std::array<unsigned_char,_4096UL>::data(&(this->Buffer).u8);
      uVar3 = std::fpos::operator_cast_to_long((fpos *)&this_local);
      std::array<unsigned_char,_4096UL>::data(&(this->Buffer).u8);
      std::streambuf::setg((char *)this,(char *)pvVar4,(char *)(pvVar5 + (uVar3 & 0xfff)));
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&Position_local._M_state,1);
      return stack0xffffffffffffffe8;
    }
  }
  std::streambuf::setg((char *)this,(char *)0x0,(char *)0x0);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&Position_local._M_state,-1);
  return stack0xffffffffffffffe8;
}

Assistant:

std::streambuf::pos_type
	ifstreambuf::seekpos(std::streambuf::pos_type Position, std::ios::openmode Mode)
{
	if( Mode & std::ios::in )
	{
		CurrentPage = static_cast<std::uint32_t>(Position) / VirtualPage::PageSize;

		if( CurrentPage < PageCount )
		{
			if( FetchPage(CurrentPage, &Buffer) )
			{
				setg(
					reinterpret_cast<char*>(Buffer.u8.data()),
					reinterpret_cast<char*>(Buffer.u8.data()) + (Position % VirtualPage::PageSize),
					reinterpret_cast<char*>(Buffer.u8.data()) + VirtualPage::PageSize
				);
				return true;
			}
		}
	}
	setg(nullptr, nullptr, nullptr);
	return std::streampos(std::streamoff(-1));
}